

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer1.c
# Opt level: O0

ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *This,ktxStream *dststr)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  ktx_uint32_t faceSlice;
  ktx_size_t imageSize;
  ktx_uint32_t numImages;
  ktx_uint32_t levelDepth;
  ktx_uint32_t layer;
  ktx_uint32_t faceLodSize;
  ktx_uint32_t levelOffset;
  ktx_uint32_t level;
  ktx_uint8_t *pKvd;
  ktx_error_code_e result;
  KTX_header header;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  uint local_8c;
  uchar **in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff8c;
  uint local_70;
  uint local_6c;
  void *local_68;
  ktx_error_code_e local_5c;
  undefined1 local_58 [12];
  undefined4 local_4c;
  undefined4 local_48;
  ktx_uint32_t local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  long local_18;
  long local_10;
  ktx_error_code_e local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_58,&DAT_006b24d0,0x40);
  local_68 = (void *)0x0;
  if (local_18 == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (*(long *)(local_10 + 0x70) == 0) {
    local_4 = KTX_INVALID_OPERATION;
  }
  else if ((*(long *)(local_10 + 0x50) == 0) || (*(long *)(local_10 + 0x60) == 0)) {
    local_4c = 0x4030201;
    local_3c = *(undefined4 *)(local_10 + 0x7c);
    local_40 = *(undefined4 *)(local_10 + 0x78);
    local_38 = *(undefined4 *)(local_10 + 0x80);
    local_48 = *(undefined4 *)(local_10 + 0x84);
    local_44 = ktxTexture1_glTypeSize((ktxTexture1 *)0x53dabd);
    local_34 = *(undefined4 *)(local_10 + 0x24);
    if (*(uint *)(local_10 + 0x30) < 2) {
      local_90 = 0;
    }
    else {
      local_90 = *(undefined4 *)(local_10 + 0x28);
    }
    local_30 = local_90;
    if (*(uint *)(local_10 + 0x30) < 3) {
      local_94 = 0;
    }
    else {
      local_94 = *(undefined4 *)(local_10 + 0x2c);
    }
    local_2c = local_94;
    if ((*(byte *)(local_10 + 0x20) & 1) == 0) {
      local_98 = 0;
    }
    else {
      local_98 = *(undefined4 *)(local_10 + 0x38);
    }
    local_28 = local_98;
    if ((*(byte *)(local_10 + 0x21) & 1) == 0) {
      if (*(int *)(local_10 + 0x3c) != 1) goto LAB_0053db8e;
    }
    else if (*(int *)(local_10 + 0x3c) != 6) {
LAB_0053db8e:
      __assert_fail("This->isCubemap ? This->numFaces == 6 : This->numFaces == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                    ,0x127,"ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)")
      ;
    }
    local_24 = *(undefined4 *)(local_10 + 0x3c);
    if ((*(byte *)(local_10 + 0x23) & 1) == 0) {
      if (*(int *)(local_10 + 0x34) == 0) goto LAB_0053dbed;
    }
    else if (*(int *)(local_10 + 0x34) != 1) {
LAB_0053dbed:
      __assert_fail("This->generateMipmaps ? This->numLevels == 1 : This->numLevels >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                    ,0x129,"ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)")
      ;
    }
    if ((*(byte *)(local_10 + 0x23) & 1) == 0) {
      local_9c = *(undefined4 *)(local_10 + 0x34);
    }
    else {
      local_9c = 0;
    }
    local_20 = local_9c;
    if (*(long *)(local_10 + 0x50) == 0) {
      if (*(long *)(local_10 + 0x60) == 0) {
        local_1c = 0;
      }
      else {
        local_68 = *(void **)(local_10 + 0x60);
        local_1c = *(int *)(local_10 + 0x58);
      }
    }
    else {
      ktxHashList_Serialize
                ((ktxHashList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    }
    local_5c = (**(code **)(local_18 + 0x10))(local_18,local_58,0x40,1);
    local_4 = local_5c;
    if (local_5c == KTX_SUCCESS) {
      if (local_1c != 0) {
        if (local_68 == (void *)0x0) {
          __assert_fail("pKvd != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/writer1.c"
                        ,0x13d,
                        "ktx_error_code_e ktxTexture1_WriteToStream(ktxTexture1 *, ktxStream *)");
        }
        local_5c = (**(code **)(local_18 + 0x10))(local_18,local_68,1,local_1c);
        if (*(long *)(local_10 + 0x50) != 0) {
          free(local_68);
        }
        if (local_5c != KTX_SUCCESS) {
          return local_5c;
        }
      }
      local_70 = 0;
      for (local_6c = 0; local_6c < *(uint *)(local_10 + 0x34); local_6c = local_6c + 1) {
        ktxTexture_doCalcFaceLodSize
                  ((ktxTexture *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,
                   0x53ddbc);
        uVar1 = (**(code **)(*(long *)(local_10 + 8) + 0x18))(local_10,local_6c);
        if (*(uint *)(local_10 + 0x2c) >> ((byte)local_6c & 0x1f) == 0) {
          local_a0 = 1;
        }
        else {
          local_a0 = *(uint *)(local_10 + 0x2c) >> ((byte)local_6c & 0x1f);
        }
        if (((*(byte *)(local_10 + 0x21) & 1) == 0) || ((*(byte *)(local_10 + 0x20) & 1) != 0)) {
          in_stack_ffffffffffffff5c = local_a0;
          if ((*(byte *)(local_10 + 0x21) & 1) != 0) {
            local_a0 = *(uint *)(local_10 + 0x3c);
            in_stack_ffffffffffffff5c = local_a0;
          }
        }
        else {
          local_a0 = *(uint *)(local_10 + 0x3c);
        }
        local_5c = (**(code **)(local_18 + 0x10))(local_18,&stack0xffffffffffffff8c,4,1);
        if (local_5c != KTX_SUCCESS) break;
        for (uVar2 = 0; uVar2 < *(uint *)(local_10 + 0x38); uVar2 = uVar2 + 1) {
          for (local_8c = 0; local_8c < local_a0; local_8c = local_8c + 1) {
            local_5c = (**(code **)(local_18 + 0x10))
                                 (local_18,*(long *)(local_10 + 0x70) + (ulong)local_70,uVar1,1);
            local_70 = (int)uVar1 + local_70;
          }
        }
      }
      local_4 = local_5c;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture1_WriteToStream(ktxTexture1* This, ktxStream* dststr)
{
    KTX_header header = { .identifier = KTX_IDENTIFIER_REF };
    KTX_error_code result = KTX_SUCCESS;
    ktx_uint8_t* pKvd = 0;
    ktx_uint32_t level, levelOffset;

    if (!dststr) {
        return KTX_INVALID_VALUE;
    }

    if (This->pData == NULL)
        return KTX_INVALID_OPERATION;

    if (This->kvDataHead && This->kvData)
        return KTX_INVALID_OPERATION;

    //endianess int.. if this comes out reversed, all of the other ints will too.
    header.endianness = KTX_ENDIAN_REF;
    header.glInternalformat = This->glInternalformat;
    header.glFormat = This->glFormat;
    header.glBaseInternalformat = This->glBaseInternalformat;
    header.glType = This->glType;
    header.glTypeSize = ktxTexture1_glTypeSize(This);
    header.pixelWidth = This->baseWidth;
    header.pixelHeight = This->numDimensions > 1 ? This->baseHeight : 0;
    header.pixelDepth = This->numDimensions > 2 ? This->baseDepth : 0;
    header.numberOfArrayElements = This->isArray ? This->numLayers : 0;
    assert (This->isCubemap ? This->numFaces == 6 : This->numFaces == 1);
    header.numberOfFaces = This->numFaces;
    assert (This->generateMipmaps ? This->numLevels == 1 : This->numLevels >= 1);
    header.numberOfMipLevels = This->generateMipmaps ? 0 : This->numLevels;

    if (This->kvDataHead != NULL) {
        ktxHashList_Serialize(&This->kvDataHead,
                              &header.bytesOfKeyValueData, &pKvd);
    } else if (This->kvData) {
        pKvd = This->kvData;
        header.bytesOfKeyValueData = This->kvDataLen;
    } else {
        header.bytesOfKeyValueData = 0;
    }

    //write header
    result = dststr->write(dststr, &header, sizeof(KTX_header), 1);
    if (result != KTX_SUCCESS)
        return result;

    //write keyValueData
    if (header.bytesOfKeyValueData != 0) {
        assert(pKvd != NULL);

        result = dststr->write(dststr, pKvd, 1, header.bytesOfKeyValueData);
        if (This->kvDataHead != NULL)
            free(pKvd);
        if (result != KTX_SUCCESS)
            return result;
    }

    /* Write the image data */
    for (level = 0, levelOffset=0; level < This->numLevels; ++level)
    {
        ktx_uint32_t faceLodSize, layer, levelDepth, numImages;
        ktx_size_t imageSize;

        faceLodSize = (ktx_uint32_t)ktxTexture_doCalcFaceLodSize(ktxTexture(This),
                                                    level,
                                                    KTX_FORMAT_VERSION_ONE);
        imageSize = ktxTexture_GetImageSize(ktxTexture(This), level);
        levelDepth = MAX(1, This->baseDepth >> level);
        if (This->isCubemap && !This->isArray)
            numImages = This->numFaces;
        else
            numImages = This->isCubemap ? This->numFaces : levelDepth;

        result = dststr->write(dststr, &faceLodSize, sizeof(faceLodSize), 1);
        if (result != KTX_SUCCESS)
            goto cleanup;

        for (layer = 0; layer < This->numLayers; layer++) {
            ktx_uint32_t faceSlice;

            for (faceSlice = 0; faceSlice < numImages; faceSlice++) {
                result = dststr->write(dststr, This->pData + levelOffset,
                                       imageSize, 1);
                levelOffset += (ktx_uint32_t)imageSize;
            }
        }
    }

cleanup:
    return result;
}